

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall
ON_Brep::IsValidVertexTolerancesAndFlags(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ON_BrepVertex *pOVar1;
  
  if (vertex_index < 0 ||
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                        (ulong)(uint)vertex_index);
      return false;
    }
  }
  else {
    pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (pOVar1[(uint)vertex_index].m_vertex_index == vertex_index) {
      if (0.0 < pOVar1[(uint)vertex_index].m_tolerance ||
          pOVar1[(uint)vertex_index].m_tolerance == 0.0) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",
                        pOVar1[(uint)vertex_index].m_tolerance);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[(uint)vertex_index].m_vertex_index,
                        (ulong)(uint)vertex_index);
    }
    ON_TextLog::PopIndent(text_log);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidVertexTolerancesAndFlags( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return false;
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return false;
  }

  return true;
}